

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O1

DecodeStatus DecodeSTRPreImm(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  bool bVar1;
  uint uVar2;
  DecodeStatus DVar3;
  void *Decoder_00;
  uint64_t Address_00;
  uint64_t Address_01;
  uint uVar4;
  
  uVar2 = Insn >> 0x10 & 0xf;
  uVar4 = Insn >> 0xc & 0xf;
  Decoder_00 = (void *)(ulong)((uint)(uVar2 != uVar4) * 2 + 1);
  MCOperand_CreateReg0(Inst,(uint)GPRDecoderTable[uVar2]);
  MCOperand_CreateReg0(Inst,(uint)GPRDecoderTable[uVar4]);
  DVar3 = DecodeAddrModeImm12Operand
                    (Inst,Insn >> 0xb & 0x1000 | uVar2 << 0xd | Insn & 0xfff,Address_00,Decoder_00);
  if (DVar3 == MCDisassembler_Fail) {
    bVar1 = false;
  }
  else {
    bVar1 = true;
    if ((DVar3 != MCDisassembler_Success) && (DVar3 != MCDisassembler_SoftFail)) {
      bVar1 = false;
    }
  }
  if (bVar1) {
    DVar3 = DecodePredicateOperand(Inst,Insn >> 0x1c,Address_01,Decoder_00);
    DVar3 = (*(code *)(&DAT_0036ae8c + *(int *)(&DAT_0036ae8c + (ulong)DVar3 * 4)))();
    return DVar3;
  }
  return MCDisassembler_Fail;
}

Assistant:

static DecodeStatus DecodeSTRPreImm(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;
	unsigned pred;
	unsigned Rn = fieldFromInstruction_4(Insn, 16, 4);
	unsigned Rt = fieldFromInstruction_4(Insn, 12, 4);
	unsigned imm = fieldFromInstruction_4(Insn, 0, 12);
	imm |= fieldFromInstruction_4(Insn, 16, 4) << 13;
	imm |= fieldFromInstruction_4(Insn, 23, 1) << 12;
	pred = fieldFromInstruction_4(Insn, 28, 4);

	if (Rn == 0xF || Rn == Rt) S = MCDisassembler_SoftFail;

	if (!Check(&S, DecodeGPRRegisterClass(Inst, Rn, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodeGPRRegisterClass(Inst, Rt, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodeAddrModeImm12Operand(Inst, imm, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodePredicateOperand(Inst, pred, Address, Decoder)))
		return MCDisassembler_Fail;

	return S;
}